

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O0

void __thiscall OpenMD::BondOrderParameter::initializeHistogram(BondOrderParameter *this)

{
  int *__x;
  mapped_type *pmVar1;
  long in_RDI;
  key_type *in_stack_00000008;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *in_stack_00000010;
  int l;
  int bin;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x714); local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0xd; local_10 = local_10 + 1) {
      __x = (int *)(in_RDI + 0x7d8);
      std::make_pair<int&,int&>(__x,(int *)0x13cd61);
      pmVar1 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](in_stack_00000010,in_stack_00000008);
      *pmVar1 = 0;
      std::make_pair<int&,int&>(__x,(int *)0x13cd9c);
      pmVar1 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](in_stack_00000010,in_stack_00000008);
      *pmVar1 = 0;
    }
  }
  return;
}

Assistant:

void BondOrderParameter::initializeHistogram() {
    for (int bin = 0; bin < nBins_; bin++) {
      for (int l = 0; l <= lMax_; l++) {
        Q_histogram_[std::make_pair(bin, l)] = 0;
        W_histogram_[std::make_pair(bin, l)] = 0;
      }
    }
  }